

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::HttpServer::HttpServer
          (HttpServer *this,Timer *timer,HttpHeaderTable *requestHeaderTable,HttpService *service,
          Settings settings)

{
  Settings settings_00;
  PromiseFulfillerPair<void> local_88;
  long local_68;
  long lStack_60;
  long local_58;
  size_t sStack_50;
  HttpService *local_48;
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_> local_40;
  HttpService *local_28;
  HttpService *service_local;
  HttpHeaderTable *requestHeaderTable_local;
  Timer *timer_local;
  HttpServer *this_local;
  
  local_48 = service;
  local_28 = service;
  service_local = (HttpService *)requestHeaderTable;
  requestHeaderTable_local = (HttpHeaderTable *)timer;
  timer_local = (Timer *)this;
  OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService>(kj::AsyncIoStream&)>>::
  OneOf<kj::HttpService*>
            ((OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService>(kj::AsyncIoStream&)>> *)
             &local_40,&local_48);
  local_68 = settings.headerTimeout.value;
  lStack_60 = settings.pipelineTimeout.value;
  local_58 = settings.canceledUploadGacePeriod.value;
  sStack_50 = settings.canceledUploadGraceBytes;
  newPromiseAndFulfiller<void>();
  settings_00.pipelineTimeout.value = lStack_60;
  settings_00.headerTimeout.value = local_68;
  settings_00.canceledUploadGacePeriod.value = local_58;
  settings_00.canceledUploadGraceBytes = sStack_50;
  HttpServer(this,timer,requestHeaderTable,&local_40,settings_00,&local_88);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_88);
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>::~OneOf
            (&local_40);
  return;
}

Assistant:

HttpServer::HttpServer(kj::Timer& timer, HttpHeaderTable& requestHeaderTable, HttpService& service,
                       Settings settings)
    : HttpServer(timer, requestHeaderTable, &service, settings,
                 kj::newPromiseAndFulfiller<void>()) {}